

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameworld.cpp
# Opt level: O2

void __thiscall CGameWorld::CGameWorld(CGameWorld *this)

{
  long lVar1;
  
  CWorldCore::CWorldCore(&this->m_Core);
  *(undefined8 *)((long)&this->m_pConfig + 2) = 0;
  *(undefined8 *)((long)&this->m_pServer + 2) = 0;
  this->m_pGameServer = (CGameContext *)0x0;
  this->m_pConfig = (CConfig *)0x0;
  for (lVar1 = 1; lVar1 != 6; lVar1 = lVar1 + 1) {
    this->m_apFirstEntityTypes[lVar1 + -1] = (CEntity *)0x0;
  }
  return;
}

Assistant:

CGameWorld::CGameWorld()
{
	m_pGameServer = 0x0;
	m_pConfig = 0x0;
	m_pServer = 0x0;

	m_Paused = false;
	m_ResetRequested = false;
	for(int i = 0; i < NUM_ENTTYPES; i++)
		m_apFirstEntityTypes[i] = 0;
}